

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FateDeck.cpp
# Opt level: O0

void __thiscall FateDeck::~FateDeck(FateDeck *this)

{
  bool bVar1;
  reference __filename;
  _Self local_28;
  _List_node_base *local_20;
  _List_iterator<GreenCard_*> local_18;
  iterator itf;
  FateDeck *this_local;
  
  (this->super_Deck)._vptr_Deck = (_func_int **)&PTR_revealDeck_0012b0e8;
  itf._M_node = (_List_node_base *)this;
  std::_List_iterator<GreenCard_*>::_List_iterator(&local_18);
  local_20 = (_List_node_base *)
             std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::begin(&this->fateDeck);
  local_18._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::end(&this->fateDeck);
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    __filename = std::_List_iterator<GreenCard_*>::operator*(&local_18);
    std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::remove
              (&this->fateDeck,(char *)__filename);
    local_18._M_node =
         (_List_node_base *)
         std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::begin(&this->fateDeck);
    std::_List_iterator<GreenCard_*>::operator++(&local_18,0);
  }
  std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::~list(&this->fateDeck);
  Deck::~Deck(&this->super_Deck);
  return;
}

Assistant:

FateDeck::~FateDeck()
{
    list<GreenCard*>::iterator itf;
    for (itf = fateDeck.begin(); itf != fateDeck.end(); itf++)
    {
        fateDeck.remove((*itf));
        //delete *itf;
        itf = fateDeck.begin();
    }
}